

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O2

PAL_ERROR FILELockFileRegion(SHMPTR shmFileLocks,PVOID pvControllerInstance,UINT64 lockRgnStart,
                            UINT64 nbBytesToLock,LOCK_TYPE lockAction)

{
  SHMPTR *pSVar1;
  DWORD DVar2;
  PAL_ERROR PVar3;
  SHMFILELOCKS *fileLocks;
  SHMFILELOCKRGNS *pSVar4;
  SHMFILELOCKRGNS *pSVar5;
  SHMFILELOCKRGNS *pSVar6;
  PAL_ERROR PVar7;
  undefined8 uVar8;
  undefined1 auStack_88 [8];
  SHMFILELOCKRGNS fakeLock;
  
  fakeLock.nbBytesLocked = 0;
  fakeLock.lockType = USER_LOCK_RGN;
  fakeLock._36_4_ = 0;
  fakeLock.pvControllerInstance = (PVOID)0x0;
  fakeLock.lockRgnStart = 0;
  auStack_88 = (undefined1  [8])0x0;
  fakeLock.processId = 0;
  fakeLock._4_4_ = 0;
  SHMLock();
  if (nbBytesToLock == 0) {
    PVar3 = 0;
joined_r0x00325bfa:
    PVar7 = PVar3;
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_00325c00:
      abort();
    }
    goto LAB_00325d97;
  }
  uVar8 = 0x1e0;
  if ((shmFileLocks != 0) &&
     (fileLocks = (SHMFILELOCKS *)SHMPtrToPtr(shmFileLocks), fileLocks != (SHMFILELOCKS *)0x0)) {
    if (fileLocks->fileLockedRgns == 0) {
      pSVar4 = (SHMFILELOCKRGNS *)0x0;
LAB_00325c11:
      PVar7 = 0;
      PVar3 = FILEAddNewLockedRgn(fileLocks,pvControllerInstance,pSVar4,lockRgnStart,nbBytesToLock,
                                  lockAction);
      if (PVar3 == 0) goto LAB_00325d97;
      goto joined_r0x00325bfa;
    }
    pSVar4 = (SHMFILELOCKRGNS *)SHMPtrToPtr(fileLocks->fileLockedRgns);
    if (pSVar4 == (SHMFILELOCKRGNS *)0x0) {
      uVar8 = 0x1ec;
    }
    else {
      DVar2 = GetCurrentProcessId();
      pSVar6 = (SHMFILELOCKRGNS *)auStack_88;
      do {
        pSVar5 = pSVar4;
        if ((pSVar5 == (SHMFILELOCKRGNS *)0x0) ||
           (lockRgnStart < pSVar5->nbBytesLocked + pSVar5->lockRgnStart)) {
          goto LAB_00325c44;
        }
        pSVar6 = pSVar5;
        pSVar4 = (SHMFILELOCKRGNS *)0x0;
      } while ((pSVar5->next == 0) ||
              (pSVar4 = (SHMFILELOCKRGNS *)SHMPtrToPtr(pSVar5->next),
              pSVar4 != (SHMFILELOCKRGNS *)0x0));
      uVar8 = 0x1fc;
    }
  }
  goto LAB_00325d57;
  while( true ) {
    if ((lockAction == USER_LOCK_RGN) ||
       ((pSVar4->lockType == USER_LOCK_RGN &&
        ((pSVar4->pvControllerInstance != pvControllerInstance || (pSVar4->processId != DVar2))))))
    goto LAB_00325dae;
    pSVar6 = pSVar4;
    pSVar5 = (SHMFILELOCKRGNS *)0x0;
    if ((pSVar4->next != 0) &&
       (pSVar5 = (SHMFILELOCKRGNS *)SHMPtrToPtr(pSVar4->next), pSVar5 == (SHMFILELOCKRGNS *)0x0))
    break;
LAB_00325c44:
    pSVar4 = pSVar5;
    if (((pSVar4 == (SHMFILELOCKRGNS *)0x0) ||
        (nbBytesToLock + lockRgnStart <= pSVar4->lockRgnStart)) ||
       (pSVar4->lockRgnStart + pSVar4->nbBytesLocked <= lockRgnStart)) goto LAB_00325d2c;
  }
  uVar8 = 0x212;
  goto LAB_00325d57;
LAB_00325dae:
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_00325c00;
  PVar7 = 0x21;
  goto LAB_00325d97;
  while( true ) {
    pSVar4 = (SHMFILELOCKRGNS *)SHMPtrToPtr(*pSVar1);
    uVar8 = 0x22b;
    if (pSVar4 == (SHMFILELOCKRGNS *)0x0) break;
LAB_00325d2c:
    do {
      if (((pSVar4 == (SHMFILELOCKRGNS *)0x0) ||
          (nbBytesToLock + lockRgnStart <= pSVar4->lockRgnStart)) ||
         (pSVar4->lockRgnStart + pSVar4->nbBytesLocked <= lockRgnStart)) {
        pSVar4 = (SHMFILELOCKRGNS *)0x0;
        if (pSVar6 != (SHMFILELOCKRGNS *)auStack_88) {
          pSVar4 = pSVar6;
        }
        goto LAB_00325c11;
      }
      if ((lockAction == USER_LOCK_RGN) ||
         ((pSVar4->lockType == USER_LOCK_RGN &&
          ((pSVar4->pvControllerInstance != pvControllerInstance || (pSVar4->processId != DVar2)))))
         ) goto LAB_00325dae;
      pSVar1 = &pSVar4->next;
      pSVar4 = (SHMFILELOCKRGNS *)0x0;
    } while (*pSVar1 == 0);
  }
LAB_00325d57:
  fprintf(_stderr,"] %s %s:%d","FILELockFileRegion",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
          ,uVar8);
  fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
  PVar7 = 0x54f;
LAB_00325d97:
  SHMRelease();
  return PVar7;
}

Assistant:

PAL_ERROR
FILELockFileRegion(
    SHMPTR shmFileLocks,
    PVOID pvControllerInstance,
    UINT64 lockRgnStart, 
    UINT64 nbBytesToLock,
    LOCK_TYPE lockAction
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMFILELOCKRGNS *curLock, *prevLock, *insertAfter, 
                     lockRgn, fakeLock = {0,0,0,0};
    SHMFILELOCKS *fileLocks;

    SHMLock();
    
    /* nothing to do if the region to lock is empty */
    if (nbBytesToLock == 0) 
    {
        TRACE("Locking an empty region (%I64d, %I64d)\n", lockRgnStart, nbBytesToLock);
        goto EXIT;
    }
    
    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE || fileLocks == NULL)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }

    if (fileLocks->fileLockedRgns != 0)
    {        
        prevLock = &fakeLock;
        
        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, fileLocks->fileLockedRgns) 
            == FALSE)
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
        
        lockRgn.lockRgnStart = lockRgnStart;
        lockRgn.nbBytesLocked = nbBytesToLock;
        lockRgn.pvControllerInstance = pvControllerInstance;
        lockRgn.processId = GetCurrentProcessId();
        lockRgn.lockType = lockAction;

        while((curLock != NULL) && IS_LOCK_BEFORE(curLock, &lockRgn))
        {            
            prevLock = curLock; 
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, curLock->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
        }
                
        while((curLock != NULL) && IS_LOCK_INTERSECT(curLock, &lockRgn))
        {
            /* we couldn't lock the requested region if it overlap with other 
               region locked explicitly (by LockFile call) by other file pointer */
            if ((lockAction == USER_LOCK_RGN) || 
                ((curLock->lockType  == USER_LOCK_RGN) && 
                 !IS_LOCK_HAVE_SAME_OWNER(curLock, &lockRgn)))
            {
                WARN("The requested lock region overlaps an existing locked region\n");
                palError = ERROR_LOCK_VIOLATION;
                goto EXIT;
            }
            
            prevLock = curLock; 
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, curLock->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
        }
        
        /* save the previous lock in case we need to insert the requested lock */
        insertAfter = prevLock;         
                
        while(((curLock != NULL) && IS_LOCK_INTERSECT(&lockRgn, curLock)))
        {
            /* we couldn't lock the requested region if it overlap with other region 
               locked explicitly (by LockFile call) by other file pointer */
            if ((lockAction == USER_LOCK_RGN) || 
                ((curLock->lockType  == USER_LOCK_RGN) &&  
                 !IS_LOCK_HAVE_SAME_OWNER(curLock, &lockRgn)))
            {
                WARN("The requested lock region overlaps an existing locked region\n");
                palError = ERROR_LOCK_VIOLATION;
                goto EXIT;
            }
            
            prevLock = curLock; 
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, curLock->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
        }
       
        if (insertAfter == &fakeLock) 
        {
            insertAfter = NULL;
        }

        palError = FILEAddNewLockedRgn(
            fileLocks,
            pvControllerInstance,
            insertAfter,
            lockRgnStart,
            nbBytesToLock,
            lockAction
            );

        if (NO_ERROR != palError)
        {
            WARN("Couldn't add the new locked region into SHM\n");
            goto EXIT;
        }
    }
    else /* lock region list is empty. */
    {
        palError = FILEAddNewLockedRgn(
            fileLocks,
            pvControllerInstance,
            NULL,
            lockRgnStart,
            nbBytesToLock,
            lockAction
            );
        
        if (NO_ERROR != palError)
        {
            ERROR("Couldn't add the first file locked region \n");
            goto EXIT;
        }
    }  

EXIT:
    SHMRelease();
    return palError;
}